

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value __thiscall Am_Value_List::Assoc_1(Am_Value_List *this,Am_Value *value_2)

{
  bool bVar1;
  Am_Assoc_Data *pAVar2;
  Am_Value *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  anon_union_8_8_ea4c8939_for_value aVar3;
  Am_Value AVar4;
  Am_Assoc_Data *assoc;
  Am_List_Item *this_item;
  Am_Value *value_2_local;
  Am_Value_List *this_local;
  
  if (*(long *)value_2 == 0) {
    Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
    aVar3 = extraout_RDX;
  }
  else {
    for (assoc = *(Am_Assoc_Data **)(*(long *)value_2 + 0x10); assoc != (Am_Assoc_Data *)0x0;
        assoc = (Am_Assoc_Data *)(assoc->value_1).value.wrapper_value) {
      pAVar2 = Am_Assoc_Data::Narrow(*(Am_Wrapper **)&(assoc->super_Am_Wrapper).refs);
      bVar1 = Am_Value::operator==(&pAVar2->value_2,in_RDX);
      if (bVar1) {
        (value_2->value).wrapper_value = &assoc->super_Am_Wrapper;
        Am_Value::Am_Value((Am_Value *)this,&pAVar2->value_1);
        aVar3 = extraout_RDX_00;
        goto LAB_0030557a;
      }
    }
    Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
    aVar3 = extraout_RDX_01;
  }
LAB_0030557a:
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

Am_Value
Am_Value_List::Assoc_1(const Am_Value &value_2)
{
  if (!data)
    return Am_No_Value;
  Am_List_Item *this_item = data->head;
  Am_Assoc_Data *assoc;
  while (this_item) {
    assoc = Am_Assoc_Data::Narrow(this_item->value.wrapper_value);
    if (assoc->value_2 == value_2) {
      item = this_item; //move pointer to found item
      return assoc->value_1;
    }
    this_item = this_item->next;
  }
  return Am_No_Value;
}